

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.hpp
# Opt level: O0

void pstore::command_line::
     apply_to_option<pstore::command_line::opt<int,pstore::command_line::parser<int,void>>&,char_const(&)[5]>
               (opt<int,_pstore::command_line::parser<int,_void>_> *opt,char (*m0) [5])

{
  name local_38;
  char (*local_18) [5];
  char (*m0_local) [5];
  opt<int,_pstore::command_line::parser<int,_void>_> *opt_local;
  
  local_18 = m0;
  m0_local = (char (*) [5])opt;
  make_modifier(&local_38,*m0);
  name::apply<pstore::command_line::opt<int,pstore::command_line::parser<int,void>>>
            (&local_38,(opt<int,_pstore::command_line::parser<int,_void>_> *)m0_local);
  name::~name(&local_38);
  apply_to_option<pstore::command_line::opt<int,pstore::command_line::parser<int,void>>&>
            ((opt<int,_pstore::command_line::parser<int,_void>_> *)m0_local);
  return;
}

Assistant:

void apply_to_option (Option && opt, M0 && m0, Mods &&... mods) {
            make_modifier (std::forward<M0> (m0)).apply (std::forward<Option> (opt));
            apply_to_option (std::forward<Option> (opt), std::forward<Mods> (mods)...);
        }